

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

AssertionResult __thiscall
testing::internal::PredicateFormatterFromMatcher<testing::Matcher<unsigned_long>>::operator()
          (void *this,char *value_text,unsigned_long *x)

{
  bool bVar1;
  ostream *poVar2;
  AssertionResult *other;
  unsigned_long *in_RCX;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  AssertionResult AVar3;
  Matcher<const_unsigned_long_&> matcher;
  stringstream ss;
  StringMatchResultListener listener;
  AssertionResult local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  MatcherBase<const_unsigned_long_&> local_350;
  stringstream local_338 [16];
  ostream local_328 [376];
  StringMatchResultListener local_1b0;
  
  SafeMatcherCastImpl<const_unsigned_long_&>::Cast<unsigned_long>
            ((Matcher<const_unsigned_long_&> *)&local_350,(Matcher<unsigned_long> *)value_text);
  StringMatchResultListener::StringMatchResultListener(&local_1b0);
  bVar1 = MatchPrintAndExplain<unsigned_long_const,unsigned_long_const&>
                    (in_RCX,(Matcher<const_unsigned_long_&> *)&local_350,
                     &local_1b0.super_MatchResultListener);
  if (bVar1) {
    AssertionSuccess();
  }
  else {
    std::__cxx11::stringstream::stringstream(local_338);
    poVar2 = std::operator<<(local_328,"Value of: ");
    poVar2 = std::operator<<(poVar2,(char *)x);
    poVar2 = std::operator<<(poVar2,"\n");
    std::operator<<(poVar2,"Expected: ");
    (*((local_350.impl_.value_)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[2]
    )(local_350.impl_.value_,local_328);
    poVar2 = std::operator<<(local_328,"\n  Actual: ");
    std::__cxx11::stringbuf::str();
    std::operator<<(poVar2,(string *)&local_370);
    std::__cxx11::string::~string((string *)&local_370);
    AssertionFailure();
    std::__cxx11::stringbuf::str();
    other = AssertionResult::operator<<(&local_380,&local_370);
    AssertionResult::AssertionResult((AssertionResult *)this,other);
    std::__cxx11::string::~string((string *)&local_370);
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&local_380.message_);
    std::__cxx11::stringstream::~stringstream(local_338);
  }
  StringMatchResultListener::~StringMatchResultListener(&local_1b0);
  MatcherBase<const_unsigned_long_&>::~MatcherBase(&local_350);
  AVar3.message_.ptr_ = extraout_RDX.ptr_;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult operator()(const char* value_text, const T& x) const {
    // We convert matcher_ to a Matcher<const T&> *now* instead of
    // when the PredicateFormatterFromMatcher object was constructed,
    // as matcher_ may be polymorphic (e.g. NotNull()) and we won't
    // know which type to instantiate it to until we actually see the
    // type of x here.
    //
    // We write SafeMatcherCast<const T&>(matcher_) instead of
    // Matcher<const T&>(matcher_), as the latter won't compile when
    // matcher_ has type Matcher<T> (e.g. An<int>()).
    // We don't write MatcherCast<const T&> either, as that allows
    // potentially unsafe downcasting of the matcher argument.
    const Matcher<const T&> matcher = SafeMatcherCast<const T&>(matcher_);
    StringMatchResultListener listener;
    if (MatchPrintAndExplain(x, matcher, &listener))
      return AssertionSuccess();

    ::std::stringstream ss;
    ss << "Value of: " << value_text << "\n"
       << "Expected: ";
    matcher.DescribeTo(&ss);
    ss << "\n  Actual: " << listener.str();
    return AssertionFailure() << ss.str();
  }